

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O0

int run_test_fs_readdir_non_existing_dir(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  int r;
  char *path;
  
  memset(&opendir_req,0xdb,0x1b8);
  uVar2 = uv_default_loop();
  iVar1 = uv_fs_opendir(uVar2,&opendir_req,"./non-existing-dir/",0);
  if (iVar1 != -2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0xbf,"r == UV_ENOENT");
    abort();
  }
  if (opendir_req.fs_type != UV_FS_OPENDIR) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0xc0,"opendir_req.fs_type == UV_FS_OPENDIR");
    abort();
  }
  if (opendir_req.result != -2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0xc1,"opendir_req.result == UV_ENOENT");
    abort();
  }
  if (opendir_req.ptr != (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0xc2,"opendir_req.ptr == NULL");
    abort();
  }
  uv_fs_req_cleanup(&opendir_req);
  memset(&opendir_req,0xdb,0x1b8);
  uVar2 = uv_default_loop();
  iVar1 = uv_fs_opendir(uVar2,&opendir_req,"./non-existing-dir/",non_existing_opendir_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0xcd,"r == 0");
    abort();
  }
  if (non_existing_opendir_cb_count != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0xce,"non_existing_opendir_cb_count == 0");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0xd0,"r == 0");
    abort();
  }
  if (non_existing_opendir_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0xd1,"non_existing_opendir_cb_count == 1");
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0xd3,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(fs_readdir_non_existing_dir) {
  const char* path;
  int r;

  path = "./non-existing-dir/";

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the synchronous flavor. */
  r = uv_fs_opendir(uv_default_loop(), &opendir_req, path, NULL);
  ASSERT(r == UV_ENOENT);
  ASSERT(opendir_req.fs_type == UV_FS_OPENDIR);
  ASSERT(opendir_req.result == UV_ENOENT);
  ASSERT(opendir_req.ptr == NULL);
  uv_fs_req_cleanup(&opendir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the async flavor. */
  r = uv_fs_opendir(uv_default_loop(),
                    &opendir_req,
                    path,
                    non_existing_opendir_cb);
  ASSERT(r == 0);
  ASSERT(non_existing_opendir_cb_count == 0);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(non_existing_opendir_cb_count == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}